

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::formatValue<ghc::filesystem::path>
               (ostream *out,char *param_2,char *fmtEnd,int ntrunc,path *value)

{
  char cVar1;
  size_type sVar2;
  allocator<char> aStack_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_50;
  
  if (-1 < ntrunc) {
    detail::formatTruncated<ghc::filesystem::path>(out,value,ntrunc);
    return;
  }
  std::operator<<(out,"\"");
  ghc::filesystem::path::string<char,std::char_traits<char>,std::allocator<char>>
            (&bStack_50,value,&aStack_51);
  for (sVar2 = 0; bStack_50._M_string_length != sVar2; sVar2 = sVar2 + 1) {
    cVar1 = bStack_50._M_dataplus._M_p[sVar2];
    if ((cVar1 == '\\') || (cVar1 == '\"')) {
      std::operator<<(out,'\\');
    }
    std::operator<<(out,cVar1);
  }
  std::operator<<(out,"\"");
  std::__cxx11::string::~string((string *)&bStack_50);
  return;
}

Assistant:

inline void formatValue(std::ostream& out, const char* /*fmtBegin*/,
                        const char* fmtEnd, int ntrunc, const T& value)
{
#ifndef TINYFORMAT_ALLOW_WCHAR_STRINGS
    // Since we don't support printing of wchar_t using "%ls", make it fail at
    // compile time in preference to printing as a void* at runtime.
    typedef typename detail::is_wchar<T>::tinyformat_wchar_is_not_supported DummyType;
    (void) DummyType(); // avoid unused type warning with gcc-4.8
#endif
    // The mess here is to support the %c and %p conversions: if these
    // conversions are active we try to convert the type to a char or const
    // void* respectively and format that instead of the value itself.  For the
    // %p conversion it's important to avoid dereferencing the pointer, which
    // could otherwise lead to a crash when printing a dangling (const char*).
    const bool canConvertToChar = detail::is_convertible<T,char>::value;
    const bool canConvertToVoidPtr = detail::is_convertible<T, const void*>::value;
    if(canConvertToChar && *(fmtEnd-1) == 'c')
        detail::formatValueAsType<T, char>::invoke(out, value);
    else if(canConvertToVoidPtr && *(fmtEnd-1) == 'p')
        detail::formatValueAsType<T, const void*>::invoke(out, value);
#ifdef TINYFORMAT_OLD_LIBSTDCPLUSPLUS_WORKAROUND
    else if(detail::formatZeroIntegerWorkaround<T>::invoke(out, value)) /**/;
#endif
    else if(ntrunc >= 0)
    {
        // Take care not to overread C strings in truncating conversions like
        // "%.4s" where at most 4 characters may be read.
        detail::formatTruncated(out, value, ntrunc);
    }
    else
        out << value;
}